

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTable
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          TableType type,Index pos)

{
  undefined1 local_b8 [8];
  Result<wasm::Table_*> t;
  undefined1 local_68 [8];
  Result<wasm::Ok> _val;
  
  checkImport((Result<wasm::Ok> *)local_68,this,pos,import);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)local_b8,(string *)local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
    addTableDecl((Result<wasm::Table_*> *)local_b8,this,pos,name,import,type);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Table_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Table_*,_wasm::Err> *)local_68,
               (_Copy_ctor_base<false,_wasm::Table_*,_wasm::Err> *)local_b8);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 0x20),(string *)local_68
                );
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Table_*,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Table_*,_wasm::Err> *)local_68);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Table_*,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Table_*,_wasm::Err> *)local_68);
      anon_unknown_2::addExports
                ((Result<wasm::Ok> *)local_68,&this->in,this->wasm,(Named *)local_b8,exports,Table);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 0x20),
                   (string *)local_68);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_4_ = pos;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._12_4_ =
             (undefined4)
             (((long)(this->tableDefs).
                     super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->tableDefs).
                    super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
        local_68 = (undefined1  [8])name.super_IString.str._M_len;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = name.super_IString.str._M_str
        ;
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
        emplace_back<wasm::WATParser::DefPos>(&this->tableDefs,(DefPos *)local_68);
        std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ::~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x10));
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Table_*,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Table_*,_wasm::Err> *)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addTable(Name name,
                                 const std::vector<Name>& exports,
                                 ImportNames* import,
                                 TableType type,
                                 Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto t = addTableDecl(pos, name, import, type);
  CHECK_ERR(t);
  CHECK_ERR(addExports(in, wasm, *t, exports, ExternalKind::Table));
  // TODO: table annotations
  tableDefs.push_back({name, pos, Index(tableDefs.size()), {}});
  return Ok{};
}